

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_33386e4::BIP32PubkeyProvider::GetExtKey
          (BIP32PubkeyProvider *this,SigningProvider *arg,CExtKey *ret)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  uchar *in_RDX;
  long *in_RSI;
  uchar *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  CKey key;
  CKey *in_stack_ffffffffffffff78;
  CKey *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 local_30 [20];
  undefined1 local_1c [20];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CKey::CKey(in_stack_ffffffffffffff78);
  CPubKey::GetID((CPubKey *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  bVar4 = (**(code **)(*in_RSI + 0x28))(in_RSI,local_1c,local_30);
  bVar5 = ((bVar4 ^ 0xff) & 1) == 0;
  if (bVar5) {
    *in_RDX = in_RDI[0x10];
    std::copy<unsigned_char_const*,unsigned_char*>
              ((uchar *)in_RSI,in_RDI,
               (uchar *)CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)
                                ));
    *(undefined4 *)(in_RDX + 8) = *(undefined4 *)(in_RDI + 0x18);
    uVar1 = *(undefined8 *)(in_RDI + 0x1c);
    uVar2 = *(undefined8 *)(in_RDI + 0x24);
    uVar3 = *(undefined8 *)(in_RDI + 0x34);
    *(undefined8 *)(in_RDX + 0x1c) = *(undefined8 *)(in_RDI + 0x2c);
    *(undefined8 *)(in_RDX + 0x24) = uVar3;
    *(undefined8 *)(in_RDX + 0xc) = uVar1;
    *(undefined8 *)(in_RDX + 0x14) = uVar2;
    CKey::operator=((CKey *)CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffff8e,
                                                    in_stack_ffffffffffffff88)),
                    in_stack_ffffffffffffff80);
  }
  CKey::~CKey(in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool GetExtKey(const SigningProvider& arg, CExtKey& ret) const
    {
        CKey key;
        if (!arg.GetKey(m_root_extkey.pubkey.GetID(), key)) return false;
        ret.nDepth = m_root_extkey.nDepth;
        std::copy(m_root_extkey.vchFingerprint, m_root_extkey.vchFingerprint + sizeof(ret.vchFingerprint), ret.vchFingerprint);
        ret.nChild = m_root_extkey.nChild;
        ret.chaincode = m_root_extkey.chaincode;
        ret.key = key;
        return true;
    }